

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict declaration(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  token_t ptVar2;
  undefined8 uVar3;
  node_code_t *pnVar4;
  short sVar5;
  node_t_conflict pnVar6;
  node *n;
  node_t_conflict pnVar7;
  node_t_conflict pnVar8;
  node_t_conflict pnVar9;
  node_t_conflict op;
  node_t pnVar10;
  char *pcVar11;
  pos_t pVar12;
  pos_t pVar13;
  node_t_conflict in_stack_ffffffffffffff78;
  uint local_74;
  node_t_conflict asm_part;
  int local_64;
  node_t_conflict local_60;
  node_t_conflict local_58;
  char *local_50;
  tpname_t local_48;
  
  ppVar1 = c2m_ctx->parse_ctx;
  asm_part = (node_t_conflict)0x0;
  ptVar2 = ppVar1->curr_token;
  if (*(short *)ptVar2 == 0x3b) {
    pcVar11 = (ptVar2->pos).fname;
    uVar3._0_4_ = (ptVar2->pos).lno;
    uVar3._4_4_ = (ptVar2->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    n = new_node(c2m_ctx,N_LIST);
    if ((ppVar1->curr_scope == c2m_ctx->top_scope) && (c2m_ctx->options->pedantic_p != 0)) {
      warning(c2m_ctx,0x1c1b99,pcVar11,uVar3);
    }
  }
  else {
    if (*(short *)ptVar2 == 0x117) {
      pnVar6 = st_assert(c2m_ctx,no_err_p);
      return pnVar6;
    }
    try_attr_spec(c2m_ctx,ptVar2->pos,(node_t_conflict *)0x0);
    pnVar6 = declaration_specs(c2m_ctx,no_err_p,
                               (node_t_conflict)(ulong)(ppVar1->curr_scope == c2m_ctx->top_scope));
    n = &err_struct;
    if (pnVar6 != &err_struct) {
      get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar6->uid);
      local_60 = new_node(c2m_ctx,N_LIST);
      if (*(short *)ppVar1->curr_token == 0x3b) {
        pnVar7 = new_node(c2m_ctx,N_IGNORE);
        pnVar8 = new_node(c2m_ctx,N_IGNORE);
        pnVar9 = new_node(c2m_ctx,N_IGNORE);
        op = new_node(c2m_ctx,N_IGNORE);
        n = local_60;
        pnVar6 = new_node4(c2m_ctx,N_SPEC_DECL,pnVar6,pnVar7,pnVar8,pnVar9);
        op_append(c2m_ctx,pnVar6,op);
        op_append(c2m_ctx,n,pnVar6);
        sVar5 = *(short *)c2m_ctx->parse_ctx->curr_token;
LAB_00194631:
        if (sVar5 == 0x3b) {
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        }
        else {
          if (ppVar1->record_level == 0) {
            pcVar11 = get_token_name(c2m_ctx,0x3b);
            syntax_error(c2m_ctx,pcVar11);
          }
LAB_0019469d:
          n = &err_struct;
        }
      }
      else {
        pnVar10 = (pnVar6->u).ops.head;
        if (pnVar10 == (node_t)0x0) {
          local_74 = 0;
        }
        else {
          do {
            pnVar4 = &pnVar10->code;
            if (*pnVar4 == N_TYPEDEF) break;
            pnVar10 = (pnVar10->op_link).next;
          } while (pnVar10 != (node_t)0x0);
          local_74 = (uint)(*pnVar4 == N_TYPEDEF);
        }
        pnVar7 = declarator(c2m_ctx,no_err_p);
        n = &err_struct;
        local_64 = no_err_p;
        local_58 = pnVar6;
        if (pnVar7 != &err_struct) {
          do {
            pVar12 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)pnVar7->uid);
            if (pnVar7->code != N_DECL) {
              __assert_fail("decl->code == N_DECL",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x1135,"node_t declaration(c2m_ctx_t, int)");
            }
            tpname_add(&local_48,(c2m_ctx_t)c2m_ctx->parse_ctx,(pnVar7->u).ops.head,
                       ppVar1->curr_scope,local_74);
            pnVar6 = try_attr_spec(c2m_ctx,pVar12,&asm_part);
            if (pnVar6 == &err_struct) {
              pnVar6 = new_node(c2m_ctx,N_IGNORE);
            }
            if (asm_part == (node_t_conflict)0x0) {
              asm_part = new_node(c2m_ctx,N_IGNORE);
            }
            if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3d) {
              read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
              pnVar8 = initializer(c2m_ctx,no_err_p);
              if (pnVar8 == &err_struct) goto LAB_0019469d;
            }
            else {
              pnVar8 = new_node(c2m_ctx,N_IGNORE);
            }
            pVar13 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)pnVar7->uid);
            pVar12.fname = pVar13._8_8_;
            local_50 = pVar13.fname;
            pnVar9 = new_node(c2m_ctx,N_SHARE);
            op_append(c2m_ctx,pnVar9,local_58);
            n = local_60;
            pVar12._8_8_ = pnVar9;
            pnVar6 = new_pos_node5(c2m_ctx,(node_code_t)local_50,pVar12,pnVar7,pnVar6,asm_part,
                                   pnVar8,in_stack_ffffffffffffff78);
            op_append(c2m_ctx,n,pnVar6);
            sVar5 = *(short *)c2m_ctx->parse_ctx->curr_token;
            if (sVar5 != 0x2c) goto LAB_00194631;
            read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
            no_err_p = local_64;
            pnVar7 = declarator(c2m_ctx,local_64);
          } while (pnVar7 != &err_struct);
          n = &err_struct;
        }
      }
    }
  }
  return n;
}

Assistant:

D (declaration) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  int typedef_p;
  node_t op, list, decl, spec, r, attrs, asm_part = NULL;
  pos_t pos, last_pos;

  if (C (T_STATIC_ASSERT)) {
    P (st_assert);
  } else if (MP (';', pos)) {
    r = new_node (c2m_ctx, N_LIST);
    if (curr_scope == top_scope && c2m_options->pedantic_p)
      warning (c2m_ctx, pos, "extra ; outside of a function");
  } else {
    try_attr_spec (c2m_ctx, curr_token->pos, NULL);
    PA (declaration_specs, curr_scope == top_scope ? (node_t) 1 : NULL);
    spec = r;
    last_pos = POS (spec);
    list = new_node (c2m_ctx, N_LIST);
    if (C (';')) {
      op_append (c2m_ctx, list,
                 new_node5 (c2m_ctx, N_SPEC_DECL, spec, new_node (c2m_ctx, N_IGNORE),
                            new_node (c2m_ctx, N_IGNORE), new_node (c2m_ctx, N_IGNORE),
                            new_node (c2m_ctx, N_IGNORE)));
    } else { /* init-declarator-list */
      for (op = NL_HEAD (spec->u.ops); op != NULL; op = NL_NEXT (op))
        if (op->code == N_TYPEDEF) break;
      typedef_p = op != NULL;
      for (;;) { /* init-declarator */
        P (declarator);
        decl = r;
        last_pos = POS (decl);
        assert (decl->code == N_DECL);
        op = NL_HEAD (decl->u.ops);
        tpname_add (c2m_ctx, op, curr_scope, typedef_p);
        attrs = try_attr_spec (c2m_ctx, last_pos, &asm_part);
        if (attrs == err_node) attrs = new_node (c2m_ctx, N_IGNORE);
        if (asm_part == NULL) asm_part = new_node (c2m_ctx, N_IGNORE);
        if (M ('=')) {
          P (initializer);
        } else {
          r = new_node (c2m_ctx, N_IGNORE);
        }
        op_append (c2m_ctx, list,
                   new_pos_node5 (c2m_ctx, N_SPEC_DECL, POS (decl),
                                  new_node1 (c2m_ctx, N_SHARE, spec), decl, attrs, asm_part, r));
        if (!M (',')) break;
      }
    }
    r = list;
    PT (';');
  }
  return r;
}